

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack8to1_int8.h
# Opt level: O0

void ncnn::convolution_pack8to1_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int s4 [4];
  __m128i _s4;
  __m128i _s1;
  __m128i _s0;
  __m128i _sh;
  __m128i _sl;
  __m128i _w;
  __m128i _val;
  int k;
  char *sptr;
  Mat m_2;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  allocator_type *in_stack_fffffffffffff9d0;
  size_type in_stack_fffffffffffff9d8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9e0;
  int local_5c8;
  int iStack_5c4;
  int iStack_5c0;
  int iStack_5bc;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  int local_544;
  long local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined4 local_520;
  long local_518;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 local_500;
  undefined8 local_4f8;
  int local_4ec;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined4 local_4d0;
  long local_4c8;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined8 local_4a8;
  ulong *local_4a0;
  int local_494;
  int local_490;
  int local_48c;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined4 local_470;
  long local_468;
  undefined4 local_460;
  undefined4 local_45c;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined8 local_448;
  long local_440;
  int local_438;
  int local_434;
  int local_430;
  int local_42c;
  int local_428;
  int local_424;
  reference local_420;
  vector<int,_std::allocator<int>_> local_400;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  long *local_3c0;
  long *local_3b8;
  long *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_388;
  undefined8 *local_378;
  undefined8 *local_368;
  undefined1 local_35d;
  int local_35c;
  undefined8 *local_350;
  undefined1 local_32d;
  int local_32c;
  long *local_328;
  undefined8 *local_320;
  undefined1 local_2fd;
  int local_2fc;
  undefined8 *local_2f0;
  long local_2a0;
  undefined4 local_294;
  long local_290;
  ulong *local_288;
  undefined4 local_27c;
  int local_278;
  int local_274;
  undefined8 *local_270;
  long local_268;
  undefined4 local_25c;
  long local_258;
  long local_250;
  undefined4 local_244;
  int local_240;
  int local_23c;
  allocator_type *local_238;
  long local_230;
  undefined4 local_224;
  long local_220;
  long local_218;
  undefined4 local_20c;
  int local_208;
  int local_204;
  undefined8 *local_200;
  undefined4 local_1f4;
  long local_1f0;
  undefined4 local_1e4;
  long local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  int *local_188;
  undefined8 *local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ulong local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  ulong uStack_140;
  ulong local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  ulong uStack_120;
  undefined1 local_118 [16];
  ulong local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  ulong local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  ulong *local_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  ulong *local_a0;
  int local_94;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_3d0 = *(int *)((long)in_RDI + 0x2c);
  local_3d4 = (int)in_RDI[7];
  local_3d8 = *(int *)((long)in_RSI + 0x2c);
  local_3dc = (int)in_RSI[6];
  local_3e0 = (int)in_RSI[7];
  local_3e4 = in_ECX * in_R8D;
  local_3cc = in_R9D;
  local_3c8 = in_R8D;
  local_3c4 = in_ECX;
  local_3c0 = in_RDX;
  local_3b8 = in_RSI;
  local_3b0 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x62b064);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::allocator<int>::~allocator((allocator<int> *)0x62b08a);
  local_420 = std::vector<int,_std::allocator<int>_>::operator[](&local_400,0);
  local_424 = 0;
  local_428 = 0;
  local_42c = local_3d0 * in_stack_00000008 - local_3c4 * local_3cc;
  for (local_430 = 0; local_430 < local_3c8; local_430 = local_430 + 1) {
    for (local_434 = 0; local_434 < local_3c4; local_434 = local_434 + 1) {
      local_420[local_424] = local_428;
      local_424 = local_424 + 1;
      local_428 = local_3cc + local_428;
    }
    local_428 = local_42c + local_428;
  }
  for (local_438 = 0; local_438 < local_3e0; local_438 = local_438 + 1) {
    local_350 = &local_488;
    local_204 = *(int *)((long)local_3b8 + 0x2c);
    local_208 = (int)local_3b8[6];
    local_20c = *(undefined4 *)((long)local_3b8 + 0x34);
    local_218 = *local_3b8 + local_3b8[8] * (long)local_438 * local_3b8[2];
    local_220 = local_3b8[2];
    local_224 = (undefined4)local_3b8[3];
    local_230 = local_3b8[4];
    local_200 = &local_488;
    local_1f0 = (long)local_204 * (long)local_208 * local_220;
    local_180 = &local_488;
    local_3a8 = &local_488;
    local_1f4 = 0x10;
    local_35c = local_438;
    local_35d = 1;
    local_488 = 0;
    local_478 = 0;
    local_470 = 0;
    local_460 = 0;
    local_45c = 0;
    local_458 = 0;
    local_454 = 0;
    local_450 = 0;
    local_448 = 0;
    local_480 = 0;
    local_440 = local_218;
    for (local_48c = 0; local_48c < local_3dc; local_48c = local_48c + 1) {
      for (local_490 = 0; local_490 < local_3d8; local_490 = local_490 + 1) {
        local_2f0 = &local_4e8;
        local_274 = *(int *)((long)local_3c0 + 0x2c);
        local_278 = (int)local_3c0[6];
        local_27c = *(undefined4 *)((long)local_3c0 + 0x34);
        local_288 = (ulong *)(*local_3c0 + local_3c0[8] * (long)local_438 * local_3c0[2]);
        local_290 = local_3c0[2];
        local_294 = (undefined4)local_3c0[3];
        local_2a0 = local_3c0[4];
        local_270 = &local_4e8;
        local_1d0 = (long)local_274 * (long)local_278 * local_290;
        local_1a0 = &local_4e8;
        local_3a0 = &local_4e8;
        local_1d4 = 0x10;
        local_2fc = local_438;
        local_2fd = 1;
        local_494 = 0;
        local_4e8 = 0;
        local_4d8 = 0;
        local_4d0 = 0;
        local_4c0 = 0;
        local_4bc = 0;
        local_4b8 = 0;
        local_4b4 = 0;
        local_4b0 = 0;
        local_4a8 = 0;
        local_4e0 = 0;
        local_4a0 = local_288;
        for (local_4ec = 0; local_4ec < local_3d4; local_4ec = local_4ec + 1) {
          local_320 = &local_538;
          local_328 = local_3b0;
          local_32c = local_4ec;
          local_23c = *(int *)((long)local_3b0 + 0x2c);
          local_240 = (int)local_3b0[6];
          local_244 = *(undefined4 *)((long)local_3b0 + 0x34);
          local_250 = *local_3b0 + local_3b0[8] * (long)local_4ec * local_3b0[2];
          local_258 = local_3b0[2];
          local_25c = (undefined4)local_3b0[3];
          local_268 = local_3b0[4];
          in_stack_fffffffffffff9d0 = (allocator_type *)&local_538;
          local_1e0 = (long)local_23c * (long)local_240 * local_258;
          local_1e4 = 0x10;
          local_32d = 1;
          local_94 = local_48c * in_stack_00000018;
          local_90 = &local_538;
          local_540 = local_250 + (long)local_23c * (long)local_94 * local_258 +
                      (long)(local_490 * in_stack_00000010 * 8);
          for (local_544 = 0; local_544 < local_3e4; local_544 = local_544 + 1) {
            local_a0 = (ulong *)(local_540 + (local_420[local_544] << 3));
            local_138 = *local_a0;
            uStack_b0 = 0;
            local_178 = ZEXT816(0) << 0x20;
            local_168._8_8_ = SUB168(ZEXT816(0),4);
            local_128 = 0;
            uStack_120 = local_168._8_8_;
            uStack_130 = 0;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_168._8_8_;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_138;
            local_f8 = vpcmpgtb_avx(auVar5 << 0x40,auVar2);
            uStack_e0 = 0;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_138;
            local_558 = vpunpcklbw_avx(auVar4,local_f8);
            local_c0 = local_4a0;
            local_158 = *local_4a0;
            uStack_d0 = 0;
            local_148 = 0;
            uStack_140 = local_168._8_8_;
            uStack_150 = 0;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_168._8_8_;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_158;
            local_118 = vpcmpgtb_avx(auVar6 << 0x40,auVar1);
            uStack_100 = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_158;
            local_568 = vpunpcklbw_avx(auVar3,local_118);
            local_78 = local_558._0_8_;
            uStack_70 = local_558._8_8_;
            local_88 = local_568._0_8_;
            uStack_80 = local_568._8_8_;
            local_578 = vpmullw_avx(local_558,local_568);
            local_58 = local_558._0_8_;
            uStack_50 = local_558._8_8_;
            local_68 = local_568._0_8_;
            uStack_60 = local_568._8_8_;
            local_588 = vpmulhw_avx(local_558,local_568);
            local_38 = local_578._0_8_;
            uStack_30 = local_578._8_8_;
            local_48 = local_588._0_8_;
            uStack_40 = local_588._8_8_;
            local_598 = vpunpcklwd_avx(local_578,local_588);
            local_18 = local_578._0_8_;
            uStack_10 = local_578._8_8_;
            local_28 = local_588._0_8_;
            uStack_20 = local_588._8_8_;
            local_5a8 = vpunpckhwd_avx(local_578,local_588);
            local_1b8 = local_598._0_8_;
            uStack_1b0 = local_598._8_8_;
            local_1c8 = local_5a8._0_8_;
            uStack_1c0 = local_5a8._8_8_;
            local_5b8 = vpaddd_avx(local_598,local_5a8);
            local_188 = &local_5c8;
            local_198 = local_5b8._0_8_;
            uStack_190 = local_5b8._8_8_;
            iStack_5c4 = local_5b8._4_4_;
            local_5c8 = local_5b8._0_4_;
            iStack_5bc = local_5b8._12_4_;
            iStack_5c0 = local_5b8._8_4_;
            local_494 = local_5c8 + iStack_5c4 + iStack_5c0 + iStack_5bc + local_494;
            local_4a0 = local_4a0 + 1;
            local_168 = local_178;
            local_108 = local_158;
            local_e8 = local_138;
            local_d8 = local_158;
            local_b8 = local_138;
          }
          local_398 = &local_538;
          local_538 = 0;
          local_528 = 0;
          local_520 = 0;
          local_510 = 0;
          local_50c = 0;
          local_508 = 0;
          local_504 = 0;
          local_500 = 0;
          local_4f8 = 0;
          local_530 = 0;
          local_388 = local_398;
          local_238 = in_stack_fffffffffffff9d0;
          local_518 = local_268;
        }
        *(int *)(local_440 + (long)local_490 * 4) = local_494;
        local_378 = local_3a0;
        local_4c8 = local_2a0;
      }
      local_440 = local_440 + (long)local_3d8 * 4;
    }
    local_368 = local_3a8;
    local_468 = local_230;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9d0);
  return;
}

Assistant:

static void convolution_pack8to1_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = weight_data_int8.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                    for (int k = 0; k < maxk; k++)
                    {
                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                        _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                        __m128i _w = _mm_loadl_epi64((const __m128i*)kptr);
                        _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                        __m128i _sl = _mm_mullo_epi16(_val, _w);
                        __m128i _sh = _mm_mulhi_epi16(_val, _w);
                        __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                        __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                        __m128i _s4 = _mm_add_epi32(_s0, _s1);

                        // TODO use _mm_hadd_epi32 on ssse3
                        int s4[4];
                        _mm_storeu_si128((__m128i*)s4, _s4);
                        sum += s4[0] + s4[1] + s4[2] + s4[3]; // dot

                        kptr += 8;
                    }
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }
}